

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O2

HighsDebugStatus
debugDualChuzcFailQuad1
          (HighsOptions *options,HighsInt workCount,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *workData,
          HighsInt numVar,double *workDual,double selectTheta,bool force)

{
  HighsDebugStatus HVar1;
  HighsLogOptions *log_options_;
  double workDualNorm;
  double workDataNorm;
  
  if ((options->super_HighsOptionsStruct).highs_debug_level < 2 && !force) {
    HVar1 = kNotChecked;
  }
  else {
    log_options_ = &(options->super_HighsOptionsStruct).log_options;
    HVar1 = kOk;
    highsLogDev(log_options_,kInfo,
                "DualChuzC:     No group identified in quad search so return error\n");
    debugDualChuzcFailNorms(workCount,workData,&workDataNorm,numVar,workDual,&workDualNorm);
    highsLogDev(log_options_,kInfo,"DualChuzC:     workCount = %d; selectTheta=%g\n",selectTheta,
                workCount);
    highsLogDev(log_options_,kInfo,"DualChuzC:     workDataNorm = %g; workDualNorm = %g\n",
                workDataNorm,workDualNorm);
  }
  return HVar1;
}

Assistant:

HighsDebugStatus debugDualChuzcFailQuad1(
    const HighsOptions& options, const HighsInt workCount,
    const std::vector<std::pair<HighsInt, double>>& workData,
    const HighsInt numVar, const double* workDual, const double selectTheta,
    const bool force) {
  // Non-trivially expensive assessment of CHUZC failure
  if (options.highs_debug_level < kHighsDebugLevelCostly && !force)
    return HighsDebugStatus::kNotChecked;

  highsLogDev(
      options.log_options, HighsLogType::kInfo,
      "DualChuzC:     No group identified in quad search so return error\n");
  double workDataNorm;
  double workDualNorm;
  debugDualChuzcFailNorms(workCount, workData, workDataNorm, numVar, workDual,
                          workDualNorm);
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     workCount = %" HIGHSINT_FORMAT
              "; selectTheta=%g\n",
              workCount, selectTheta);
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     workDataNorm = %g; workDualNorm = %g\n",
              workDataNorm, workDualNorm);
  return HighsDebugStatus::kOk;
}